

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_service_client_auth.c
# Opt level: O3

void free_service_client_auth(IOTHUB_SERVICE_CLIENT_AUTH *authInfo)

{
  free(authInfo->hostname);
  free(authInfo->iothubName);
  free(authInfo->iothubSuffix);
  free(authInfo->sharedAccessKey);
  free(authInfo->keyName);
  free(authInfo->deviceId);
  free(authInfo);
  return;
}

Assistant:

static void free_service_client_auth(IOTHUB_SERVICE_CLIENT_AUTH* authInfo)
{
    free(authInfo->hostname);
    free(authInfo->iothubName);
    free(authInfo->iothubSuffix);
    free(authInfo->sharedAccessKey);
    free(authInfo->keyName);
    free(authInfo->deviceId);
    free(authInfo);
}